

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstruct<long_double>::ComputeWeightsLocal
          (TPZDohrSubstruct<long_double> *this,TPZFMatrix<long_double> *StiffnessDiagLocal)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  longdouble *plVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int local_38;
  
  uVar2 = (this->fGlobalEqs).fNElements;
  uVar5 = (uint)uVar2;
  if (0 < (int)uVar5) {
    lVar10 = 0;
    uVar8 = 0;
    do {
      iVar1 = *(int *)((long)&((this->fGlobalEqs).fStore)->first + lVar10);
      if (((StiffnessDiagLocal->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow <=
           (long)uVar8) ||
         ((StiffnessDiagLocal->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      (this->fWeights).super_TPZVec<long_double>.fStore[iVar1] =
           (this->fWeights).super_TPZVec<long_double>.fStore[iVar1] /
           *(longdouble *)((long)StiffnessDiagLocal->fElem + lVar10 * 2);
      uVar8 = uVar8 + 1;
      lVar10 = lVar10 + 8;
    } while ((uVar5 & 0x7fffffff) != uVar8);
  }
  lVar10 = (this->fInternalEqs).fNElements;
  if (0 < lVar10) {
    piVar3 = (this->fInternalEqs).fStore;
    plVar4 = (this->fWeights).super_TPZVec<long_double>.fStore;
    lVar7 = 0;
    do {
      plVar4[piVar3[lVar7]] = (longdouble)1;
      lVar7 = lVar7 + 1;
    } while (lVar10 != lVar7);
  }
  uVar8 = (this->fPhiC).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol;
  TPZFMatrix<long_double>::Resize(&this->fPhiC_Weighted_Condensed,(long)(int)uVar5,uVar8);
  if (0 < (int)uVar5) {
    uVar6 = 0;
    do {
      local_38 = (int)uVar8;
      if (0 < local_38) {
        uVar9 = 0;
        do {
          lVar10 = (long)(this->fGlobalEqs).fStore[uVar6].first;
          if (((lVar10 < 0) ||
              ((this->fPhiC).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow <= lVar10)) ||
             ((this->fPhiC).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol <= (long)uVar9)) {
            TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((this->fPhiC_Weighted_Condensed).super_TPZMatrix<long_double>.super_TPZBaseMatrix.
               fRow <= (long)uVar6) ||
             ((this->fPhiC_Weighted_Condensed).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol
              <= (long)uVar9)) {
            TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          (this->fPhiC_Weighted_Condensed).fElem
          [(this->fPhiC_Weighted_Condensed).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow *
           uVar9 + uVar6] =
               (this->fWeights).super_TPZVec<long_double>.fStore[lVar10] *
               (this->fPhiC).fElem
               [(this->fPhiC).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow * uVar9 + lVar10
               ];
          uVar9 = uVar9 + 1;
        } while ((uVar8 & 0x7fffffff) != uVar9);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uVar2 & 0x7fffffff));
  }
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ComputeWeightsLocal(TPZFMatrix<TVar> &StiffnessDiagLocal) {
	int i;
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		fWeights[ind.first] = fWeights[ind.first] / StiffnessDiagLocal(i,0);
	}
	for(i=0; i<fInternalEqs.NElements(); i++)
	{
		fWeights[fInternalEqs[i]] = 1.;
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Weights = " <<  fWeights;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	int c,nc = fPhiC.Cols();
#ifdef ZERO_INTERNAL_RESIDU
	// eliminate the values of v2 for internal equations
	int nint = fInternalEqs.NElements();
	for(i=0; i<nint; i++)
	{
		for(c=0; c<nc; c++)
		{
			fPhiC(fInternalEqs[i],c) = 0.;
		}
	}
#endif
	fPhiC_Weighted_Condensed.Resize(neqs,fPhiC.Cols());
	for (i=0;i<neqs;i++) 
	{
		for(c=0; c<nc; c++)
		{
			std::pair<int,int> ind = fGlobalEqs[i];
			fPhiC_Weighted_Condensed(i,c) = fPhiC(ind.first,c)*fWeights[ind.first];
		}
	}
}